

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O2

_Bool AArch64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  byte bVar2;
  cs_detail *__s;
  DecodeStatus DVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint16_t uVar6;
  uint8_t *puVar7;
  long lVar8;
  MCInst *MI;
  uint uVar9;
  uint uVar10;
  uint8_t *puVar11;
  uint uVar12;
  uint local_4c;
  DecodeStatus local_48;
  uint local_44;
  MCInst *local_40;
  uint16_t *local_38;
  
  uVar6 = 0;
  DVar3 = MCDisassembler_Fail;
  if (3 < code_len) {
    __s = instr->flat_insn->detail;
    local_38 = size;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x220);
      for (lVar8 = 0; lVar8 != 0x1c0; lVar8 = lVar8 + 0x38) {
        puVar7 = instr->flat_insn->detail->groups + lVar8 + 0x15;
        puVar7[0] = 0xff;
        puVar7[1] = 0xff;
        puVar7[2] = 0xff;
        puVar7[3] = 0xff;
      }
    }
    if (*(int *)(ud + 4) < 0) {
      uVar9 = *(uint *)code;
      uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    }
    else {
      uVar9 = *(uint *)code;
    }
    local_44 = ~uVar9;
    uVar12 = 0;
    local_48 = MCDisassembler_Success;
    puVar7 = "\x01\x1a\x03\x02\x02V\x04\x01\x1d\x03\x02";
    local_40 = instr;
LAB_001dc894:
    puVar11 = puVar7;
    MI = local_40;
    switch(*puVar11) {
    case '\x01':
      bVar2 = puVar11[2];
      local_4c = (uint)bVar2;
      uVar12 = ~(-1 << (bVar2 & 0x1f)) << (puVar11[1] & 0x1f);
      if (bVar2 == 0x20) {
        uVar12 = 0xffffffff;
      }
      uVar12 = (uVar12 & uVar9) >> (puVar11[1] & 0x1f);
      puVar7 = puVar11 + 3;
      goto LAB_001dc894;
    case '\x02':
      uVar4 = decodeULEB128(puVar11 + 1,&local_4c);
      puVar7 = puVar11 + (ulong)local_4c + 3;
      if (uVar12 == (uint)uVar4) goto LAB_001dc894;
      lVar8 = (ulong)local_4c + 1;
      break;
    case '\x03':
      bVar2 = puVar11[1];
      bVar1 = puVar11[2];
      local_4c = (uint)bVar1;
      uVar10 = ~(-1 << (bVar1 & 0x1f)) << (bVar2 & 0x1f);
      if (bVar1 == 0x20) {
        uVar10 = 0xffffffff;
      }
      uVar4 = decodeULEB128(puVar11 + 3,&local_4c);
      puVar7 = puVar11 + (ulong)local_4c + 5;
      if ((uVar10 & uVar9) >> (bVar2 & 0x1f) == (uint)uVar4) goto LAB_001dc894;
      lVar8 = (ulong)local_4c + 3;
      break;
    case '\x04':
      decodeULEB128(puVar11 + 1,&local_4c);
      puVar7 = puVar11 + (ulong)local_4c + 3;
      goto LAB_001dc894;
    case '\x05':
      goto switchD_001dc8ac_caseD_5;
    case '\x06':
      goto switchD_001dc8ac_caseD_6;
    default:
      goto switchD_001dc8ac_default;
    }
    puVar7 = puVar7 + *(ushort *)(puVar11 + lVar8);
    goto LAB_001dc894;
  }
LAB_001dca3a:
  *size = uVar6;
  return DVar3 == MCDisassembler_Success;
switchD_001dc8ac_caseD_6:
  uVar4 = decodeULEB128(puVar11 + 1,&local_4c);
  puVar11 = puVar11 + (ulong)local_4c + 1;
  uVar5 = decodeULEB128(puVar11,&local_4c);
  puVar7 = puVar11 + local_4c;
  if (((uint)uVar5 & local_44) != 0 || ((uint)uVar4 & uVar9) != 0) {
    local_48 = MCDisassembler_SoftFail;
  }
  goto LAB_001dc894;
switchD_001dc8ac_caseD_5:
  uVar4 = decodeULEB128(puVar11 + 1,&local_4c);
  uVar5 = decodeULEB128(puVar11 + (ulong)local_4c + 1,&local_4c);
  MI = local_40;
  MCInst_setOpcode(local_40,(uint)uVar4);
  DVar3 = decodeToMCInst(local_48,(uint)uVar5,uVar9,MI,(uint64_t)size,(void *)address);
  if (DVar3 == MCDisassembler_Fail) {
switchD_001dc8ac_default:
    MCInst_clear(MI);
    uVar6 = 0;
    DVar3 = MCDisassembler_Fail;
    size = local_38;
  }
  else {
    uVar6 = 4;
    size = local_38;
  }
  goto LAB_001dca3a;
}

Assistant:

bool AArch64_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _getInstruction((cs_struct *)ud, instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}